

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,StringRef message)

{
  pointer pIVar1;
  TestCaseInfo *_testInfo;
  TestCaseInfo *_stdOut;
  undefined8 in_RDX;
  size_t in_RSI;
  long in_RDI;
  Totals deltaTotals;
  TestCaseInfo *testInfo;
  SectionStats testCaseSectionStats;
  Counts assertions;
  SectionInfo testCaseSection;
  TestCaseInfo *testCaseInfo;
  AssertionResult result;
  AssertionResultData tempResult;
  TestCaseStats *in_stack_fffffffffffffa70;
  TestRunStats *this_00;
  AssertionInfo *in_stack_fffffffffffffa78;
  RunContext *in_stack_fffffffffffffa80;
  SectionInfo *in_stack_fffffffffffffa88;
  TestCaseInfo *pTVar2;
  undefined1 _aborting;
  SectionStats *in_stack_fffffffffffffa90;
  Totals *_totals;
  undefined8 in_stack_fffffffffffffa98;
  OfType _resultType;
  string *this_01;
  AssertionResultData *in_stack_fffffffffffffaa0;
  TestRunStats *this_02;
  StringRef *in_stack_fffffffffffffaa8;
  Totals *_totals_00;
  TestCaseStats *this_03;
  undefined1 local_520 [144];
  size_t in_stack_fffffffffffffb70;
  size_t in_stack_fffffffffffffb78;
  Totals *in_stack_fffffffffffffb80;
  string *in_stack_fffffffffffffb88;
  RunContext *in_stack_fffffffffffffb90;
  string local_460 [8];
  AssertionResult *in_stack_fffffffffffffba8;
  RunContext *in_stack_fffffffffffffbb0;
  string local_440 [32];
  undefined1 local_420 [360];
  Totals local_2b8;
  TestCaseInfo *local_248;
  undefined1 local_240 [128];
  Totals local_1c0 [2];
  undefined1 local_b0 [136];
  undefined4 local_28;
  undefined4 uStack_24;
  SpecialProperties SStack_20;
  undefined4 uStack_1c;
  undefined8 local_10;
  SpecialProperties SStack_8;
  undefined4 uStack_4;
  
  _resultType = (OfType)((ulong)in_stack_fffffffffffffa98 >> 0x20);
  local_10 = in_RSI;
  _SStack_8 = in_RDX;
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x269a08);
  local_28 = (undefined4)local_10;
  uStack_24 = local_10._4_4_;
  SStack_20 = SStack_8;
  uStack_1c = uStack_4;
  (*pIVar1->_vptr_IStreamingReporter[0x10])(pIVar1,local_10,_SStack_8);
  LazyExpression::LazyExpression((LazyExpression *)(local_b0 + 0x20),false);
  AssertionResultData::AssertionResultData
            (in_stack_fffffffffffffaa0,_resultType,(LazyExpression *)in_stack_fffffffffffffa90);
  StringRef::operator_cast_to_string(in_stack_fffffffffffffaa8);
  this_03 = (TestCaseStats *)local_b0;
  std::__cxx11::string::operator=((string *)(local_b0 + 0x30),(string *)this_03);
  std::__cxx11::string::~string((string *)this_03);
  AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             (AssertionResultData *)in_stack_fffffffffffffa70);
  assertionEnded(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  handleUnfinishedSections(in_stack_fffffffffffffa80);
  _testInfo = TestCase::getTestCaseInfo(*(TestCase **)(in_RDI + 0x38));
  local_1c0[0].skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)_testInfo;
  SectionInfo::SectionInfo
            ((SectionInfo *)in_stack_fffffffffffffa80,(SourceLineInfo *)in_stack_fffffffffffffa78,
             (string *)in_stack_fffffffffffffa70);
  _totals_00 = local_1c0;
  Counts::Counts((Counts *)_totals_00);
  local_1c0[0].skippedTests = 1;
  SectionStats::SectionStats
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,(Counts *)in_stack_fffffffffffffa80
             ,(double)in_stack_fffffffffffffa78,SUB81((ulong)in_stack_fffffffffffffa70 >> 0x38,0));
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x269b75);
  (*pIVar1->_vptr_IStreamingReporter[0xb])(pIVar1,local_240);
  _stdOut = TestCase::getTestCaseInfo(*(TestCase **)(in_RDI + 0x38));
  _totals = &local_2b8;
  local_248 = _stdOut;
  Totals::Totals((Totals *)in_stack_fffffffffffffa70);
  local_2b8.testCases.failed = 1;
  local_2b8.assertions.failed = 1;
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x269be8);
  this_01 = local_440;
  pTVar2 = local_248;
  std::__cxx11::string::string(this_01);
  _aborting = (undefined1)((ulong)pTVar2 >> 0x38);
  this_02 = (TestRunStats *)local_460;
  std::__cxx11::string::string((string *)this_02);
  TestCaseStats::TestCaseStats
            (this_03,_testInfo,_totals_00,&_stdOut->name,(string *)this_02,
             SUB81((ulong)this_01 >> 0x38,0));
  (*pIVar1->_vptr_IStreamingReporter[0xc])(pIVar1,local_420);
  TestCaseStats::~TestCaseStats(in_stack_fffffffffffffa70);
  std::__cxx11::string::~string(local_460);
  std::__cxx11::string::~string(local_440);
  *(long *)(in_RDI + 0x120) = *(long *)(in_RDI + 0x120) + 1;
  this_00 = (TestRunStats *)&stack0xfffffffffffffb80;
  std::__cxx11::string::string((string *)this_00);
  testGroupEnded(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                 in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb80);
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x269cf7);
  TestRunStats::TestRunStats(this_02,(TestRunInfo *)this_01,_totals,(bool)_aborting);
  (*pIVar1->_vptr_IStreamingReporter[0xe])(pIVar1,local_520);
  TestRunStats::~TestRunStats(this_00);
  Totals::~Totals((Totals *)0x269d47);
  SectionStats::~SectionStats((SectionStats *)0x269d54);
  SectionInfo::~SectionInfo((SectionInfo *)this_00);
  AssertionResult::~AssertionResult((AssertionResult *)0x269d6e);
  AssertionResultData::~AssertionResultData((AssertionResultData *)this_00);
  return;
}

Assistant:

void RunContext::handleFatalErrorCondition( StringRef message ) {
        // First notify reporter that bad things happened
        m_reporter->fatalErrorEncountered(message);

        // Don't rebuild the result -- the stringification itself can cause more fatal errors
        // Instead, fake a result data.
        AssertionResultData tempResult( ResultWas::FatalErrorCondition, { false } );
        tempResult.message = static_cast<std::string>(message);
        AssertionResult result(m_lastAssertionInfo, tempResult);

        assertionEnded(result);

        handleUnfinishedSections();

        // Recreate section for test case (as we will lose the one that was in scope)
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);

        Counts assertions;
        assertions.failed = 1;
        SectionStats testCaseSectionStats(testCaseSection, assertions, 0, false);
        m_reporter->sectionEnded(testCaseSectionStats);

        auto const& testInfo = m_activeTestCase->getTestCaseInfo();

        Totals deltaTotals;
        deltaTotals.testCases.failed = 1;
        deltaTotals.assertions.failed = 1;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  std::string(),
                                  std::string(),
                                  false));
        m_totals.testCases.failed++;
        testGroupEnded(std::string(), m_totals, 1, 1);
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, false));
    }